

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

char * __thiscall
google::protobuf::EnumOptions::_InternalParse(EnumOptions *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  byte bVar2;
  int iVar3;
  Rep *pRVar4;
  bool bVar5;
  UninterpretedOption *msg;
  byte *pbVar6;
  uint uVar7;
  char cVar8;
  uint32 uVar9;
  uint uVar10;
  UnknownFieldSet *unknown;
  char cVar11;
  ulong tag;
  uint uVar12;
  pair<const_char_*,_unsigned_int> pVar13;
  pair<const_char_*,_unsigned_long> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  byte *local_38;
  char *ptr_local;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar12 = 0;
  local_38 = (byte *)ptr;
  do {
    bVar5 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar5) goto LAB_002a838a;
    bVar1 = *local_38;
    pVar13.second._0_1_ = bVar1;
    pVar13.first = (char *)(local_38 + 1);
    pVar13._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = local_38[1];
      uVar9 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar13 = internal::ReadTagFallback((char *)local_38,uVar9);
      }
      else {
        pVar13.second = uVar9;
        pVar13.first = (char *)(local_38 + 2);
        pVar13._12_4_ = 0;
      }
    }
    local_38 = (byte *)pVar13.first;
    cVar11 = '\x04';
    if (local_38 != (byte *)0x0) {
      uVar10 = pVar13.second;
      uVar7 = (uint)(pVar13._8_8_ >> 3) & 0x1fffffff;
      cVar8 = (char)pVar13.second;
      if (uVar7 == 999) {
        if (cVar8 != ':') goto LAB_002a8283;
        local_38 = local_38 + -2;
        do {
          local_38 = local_38 + 2;
          pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar4 == (Rep *)0x0) {
LAB_002a820b:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,
                       (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_002a8219:
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            pRVar4->allocated_size = pRVar4->allocated_size + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            pRVar4->elements[iVar3] = msg;
          }
          else {
            iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar4->allocated_size <= iVar3) {
              if (pRVar4->allocated_size ==
                  (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_002a820b;
              goto LAB_002a8219;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
            msg = (UninterpretedOption *)pRVar4->elements[iVar3];
          }
          local_38 = (byte *)internal::ParseContext::
                             ParseMessage<google::protobuf::UninterpretedOption>
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) goto LAB_002a835f;
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_38 == 0x3eba));
        cVar11 = '\x02';
      }
      else {
        if (uVar7 == 3) {
          if (cVar8 != '\x18') goto LAB_002a8283;
          bVar1 = *local_38;
          pVar14.second = (long)(char)bVar1;
          pVar14.first = (char *)local_38;
          pbVar6 = local_38 + 1;
          if ((long)(char)bVar1 < 0) {
            uVar9 = ((uint)*pbVar6 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*pbVar6 < '\0') {
              pVar14 = internal::VarintParseSlow64((char *)local_38,uVar9);
            }
            else {
              pVar14.second._0_4_ = uVar9;
              pVar14.first = (char *)(local_38 + 2);
              pVar14.second._4_4_ = 0;
            }
            pbVar6 = (byte *)pVar14.first;
          }
          uVar12 = uVar12 | 2;
          this->deprecated_ = pVar14.second != 0;
        }
        else {
          if ((uVar7 != 2) || (cVar8 != '\x10')) {
LAB_002a8283:
            if (uVar10 == 0 || (uVar10 & 7) == 4) {
              (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar10 - 1;
              cVar11 = '\t';
            }
            else {
              tag = pVar13._8_8_ & 0xffffffff;
              if (uVar10 < 8000) {
                if (((ulong)this_00->ptr_ & 1) == 0) {
                  unknown = internal::InternalMetadata::
                            mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
                }
                else {
                  unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
                }
                local_38 = (byte *)internal::UnknownFieldParse(tag,unknown,(char *)local_38,ctx);
              }
              else {
                local_38 = (byte *)internal::ExtensionSet::ParseField
                                             (&this->_extensions_,tag,(char *)local_38,
                                              (Message *)_EnumOptions_default_instance_,this_00,ctx)
                ;
              }
              cVar11 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
            }
            goto LAB_002a835f;
          }
          bVar1 = *local_38;
          pVar15.second = (long)(char)bVar1;
          pVar15.first = (char *)local_38;
          pbVar6 = local_38 + 1;
          if ((long)(char)bVar1 < 0) {
            uVar9 = ((uint)*pbVar6 * 0x80 + (uint)bVar1) - 0x80;
            if ((char)*pbVar6 < '\0') {
              pVar15 = internal::VarintParseSlow64((char *)local_38,uVar9);
            }
            else {
              pVar15.second._0_4_ = uVar9;
              pVar15.first = (char *)(local_38 + 2);
              pVar15.second._4_4_ = 0;
            }
            pbVar6 = (byte *)pVar15.first;
          }
          uVar12 = uVar12 | 1;
          this->allow_alias_ = pVar15.second != 0;
        }
        cVar11 = (pbVar6 == (byte *)0x0) * '\x02' + '\x02';
        local_38 = pbVar6;
      }
    }
LAB_002a835f:
  } while (cVar11 == '\x02');
  if (cVar11 == '\x04') {
    local_38 = (byte *)0x0;
  }
LAB_002a838a:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar12;
  return (char *)local_38;
}

Assistant:

const char* EnumOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool allow_alias = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_allow_alias(&has_bits);
          allow_alias_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}